

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

undefined4 testing::internal::BuiltInDefaultValue<TestCallExprBuilder>::Get(void)

{
  allocator<char> local_29;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"Default action undefined for the function return type.",&local_29)
  ;
  Assert(false,
         "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/../thirdparty/gmock/gmock.h"
         ,0x3d5,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return _DAT_00000000;
}

Assistant:

static T Get() {
    Assert(false, __FILE__, __LINE__,
           "Default action undefined for the function return type.");
    return internal::Invalid<T>();
    // The above statement will never be reached, but is required in
    // order for this function to compile.
  }